

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool RestoreParentTypeScope(ExpressionContext *ctx,SynBase *source,TypeBase *parentType)

{
  uint uVar1;
  TypeBase *type;
  SynIdentifier *pSVar2;
  VariableData *type_00;
  ScopeData *scope;
  TypeClass *pTVar3;
  AliasData *pAVar4;
  TypeGenericClassProto *pTVar5;
  TypeGenericAlias *type_01;
  SynIdentifier *local_60;
  SynIdentifier *curr;
  SynClassDefinition *definition;
  TypeGenericClassProto *genericProto;
  MemberHandle *el_2;
  MatchData *el_1;
  MatchData *el;
  TypeClass *classType;
  TypeBase *parentType_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((parentType == (TypeBase *)0x0) || (ctx->scope->ownerType == parentType)) {
    ctx_local._7_1_ = false;
  }
  else {
    ExpressionContext::PushScope(ctx,parentType);
    pTVar3 = getType<TypeClass>(parentType);
    if (pTVar3 == (TypeClass *)0x0) {
      pTVar5 = getType<TypeGenericClassProto>(parentType);
      if (pTVar5 != (TypeGenericClassProto *)0x0) {
        for (local_60 = (pTVar5->definition->aliases).head; local_60 != (SynIdentifier *)0x0;
            local_60 = getType<SynIdentifier>((local_60->super_SynBase).next)) {
          pAVar4 = ExpressionContext::get<AliasData>(ctx);
          scope = ctx->scope;
          type_01 = ExpressionContext::GetGenericAliasType(ctx,local_60);
          uVar1 = ctx->uniqueAliasId;
          ctx->uniqueAliasId = uVar1 + 1;
          AliasData::AliasData(pAVar4,source,scope,&type_01->super_TypeBase,local_60,uVar1);
          ExpressionContext::AddAlias(ctx,pAVar4);
        }
      }
    }
    else {
      for (el_1 = (pTVar3->generics).head; el_1 != (MatchData *)0x0; el_1 = el_1->next) {
        pAVar4 = ExpressionContext::get<AliasData>(ctx);
        type = el_1->type;
        pSVar2 = el_1->name;
        uVar1 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar1 + 1;
        AliasData::AliasData(pAVar4,source,ctx->scope,type,pSVar2,uVar1);
        ExpressionContext::AddAlias(ctx,pAVar4);
      }
      for (el_2 = (MemberHandle *)(pTVar3->aliases).head; el_2 != (MemberHandle *)0x0;
          el_2 = (MemberHandle *)el_2->initializer) {
        pAVar4 = ExpressionContext::get<AliasData>(ctx);
        type_00 = el_2->variable;
        pSVar2 = (SynIdentifier *)el_2->source;
        uVar1 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar1 + 1;
        AliasData::AliasData(pAVar4,source,ctx->scope,(TypeBase *)type_00,pSVar2,uVar1);
        ExpressionContext::AddAlias(ctx,pAVar4);
      }
      for (genericProto = (TypeGenericClassProto *)(pTVar3->super_TypeStruct).members.head;
          genericProto != (TypeGenericClassProto *)0x0;
          genericProto = (TypeGenericClassProto *)(genericProto->super_TypeBase).name.end) {
        ExpressionContext::AddVariable
                  (ctx,*(VariableData **)&(genericProto->super_TypeBase).typeID,true);
      }
    }
    ctx_local._7_1_ = true;
  }
  return ctx_local._7_1_;
}

Assistant:

bool RestoreParentTypeScope(ExpressionContext &ctx, SynBase *source, TypeBase *parentType)
{
	if(parentType && ctx.scope->ownerType != parentType)
	{
		ctx.PushScope(parentType);

		if(TypeClass *classType = getType<TypeClass>(parentType))
		{
			for(MatchData *el = classType->generics.head; el; el = el->next)
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			for(MatchData *el = classType->aliases.head; el; el = el->next)
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			for(MemberHandle *el = classType->members.head; el; el = el->next)
				ctx.AddVariable(el->variable, true);
		}
		else if(TypeGenericClassProto *genericProto = getType<TypeGenericClassProto>(parentType))
		{
			SynClassDefinition *definition = genericProto->definition;

			for(SynIdentifier *curr = definition->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, ctx.GetGenericAliasType(curr), curr, ctx.uniqueAliasId++));
		}

		return true;
	}

	return false;
}